

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,str_writer<wchar_t> *f)

{
  size_t sVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  wchar_t __tmp;
  wchar_t *__src;
  size_t size;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  basic_buffer<wchar_t> *c;
  int iVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar13 = (ulong)spec->width_;
  uVar8 = f->size_;
  puVar3 = *(undefined8 **)this;
  lVar9 = puVar3[2];
  uVar10 = uVar13 - uVar8;
  if (uVar13 < uVar8 || uVar10 == 0) {
    uVar10 = lVar9 + uVar8;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
      uVar8 = f->size_;
    }
    puVar3[2] = uVar10;
    if (uVar8 != 0) {
      pvVar11 = (void *)(lVar9 * 4 + puVar3[1]);
      __src = f->s;
LAB_00131243:
      memmove(pvVar11,__src,uVar8 << 2);
      return;
    }
  }
  else {
    uVar12 = lVar9 + uVar13;
    if ((ulong)puVar3[3] < uVar12) {
      (**(code **)*puVar3)(puVar3,uVar12);
    }
    puVar3[2] = uVar12;
    auVar6 = _DAT_00159050;
    auVar5 = _DAT_00159040;
    auVar4 = _DAT_00159030;
    lVar7 = puVar3[1];
    pvVar11 = (void *)(lVar7 + lVar9 * 4);
    wVar2 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar12 = uVar10 >> 1;
      if (1 < uVar10) {
        pvVar11 = (void *)((long)pvVar11 + uVar12 * 4);
        uVar10 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar10;
        auVar24._0_8_ = uVar10;
        auVar24._12_4_ = (int)(uVar10 >> 0x20);
        lVar7 = lVar7 + lVar9 * 4;
        lVar9 = 0;
        auVar24 = auVar24 ^ _DAT_00159050;
        do {
          auVar21._8_4_ = (int)lVar9;
          auVar21._0_8_ = lVar9;
          auVar21._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar25 = (auVar21 | auVar5) ^ auVar6;
          iVar19 = auVar24._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar19 && auVar24._0_4_ < auVar25._0_4_ ||
                      iVar19 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar7 + lVar9 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
              auVar25._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar7 + 4 + lVar9 * 4) = wVar2;
          }
          auVar21 = (auVar21 | auVar4) ^ auVar6;
          iVar26 = auVar21._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar21._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar7 + 8 + lVar9 * 4) = wVar2;
            *(wchar_t *)(lVar7 + 0xc + lVar9 * 4) = wVar2;
          }
          lVar9 = lVar9 + 4;
        } while ((uVar10 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar9);
      }
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(pvVar11,f->s,sVar1);
      }
      auVar6 = _DAT_00159050;
      auVar5 = _DAT_00159040;
      auVar4 = _DAT_00159030;
      uVar10 = (uVar13 * 4 + (uVar8 + uVar12) * -4) - 4;
      auVar25._8_4_ = (int)uVar10;
      auVar25._0_8_ = uVar10;
      auVar25._12_4_ = (int)(uVar10 >> 0x20);
      auVar16._0_8_ = uVar10 >> 2;
      auVar16._8_8_ = auVar25._8_8_ >> 2;
      uVar8 = 0;
      auVar16 = auVar16 ^ _DAT_00159050;
      do {
        auVar22._8_4_ = (int)uVar8;
        auVar22._0_8_ = uVar8;
        auVar22._12_4_ = (int)(uVar8 >> 0x20);
        auVar24 = (auVar22 | auVar5) ^ auVar6;
        iVar19 = auVar16._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar16._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(wchar_t *)((long)pvVar11 + uVar8 * 4 + sVar1) = wVar2;
        }
        if ((auVar24._12_4_ != auVar16._12_4_ || auVar24._8_4_ <= auVar16._8_4_) &&
            auVar24._12_4_ <= auVar16._12_4_) {
          *(wchar_t *)((long)pvVar11 + uVar8 * 4 + sVar1 + 4) = wVar2;
        }
        auVar24 = (auVar22 | auVar4) ^ auVar6;
        iVar26 = auVar24._4_4_;
        if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar16._0_4_)) {
          *(wchar_t *)((long)pvVar11 + uVar8 * 4 + sVar1 + 8) = wVar2;
          *(wchar_t *)((long)pvVar11 + uVar8 * 4 + sVar1 + 0xc) = wVar2;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar10 >> 2) + 4 & 0x7ffffffffffffffc) != uVar8);
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pvVar11 = (void *)((long)pvVar11 + uVar10 * 4);
      uVar10 = (uVar13 * 4 + uVar8 * -4) - 4;
      auVar14._8_4_ = (int)uVar10;
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = (int)(uVar10 >> 0x20);
      auVar15._0_8_ = uVar10 >> 2;
      auVar15._8_8_ = auVar14._8_8_ >> 2;
      lVar7 = lVar7 + lVar9 * 4;
      uVar8 = 0;
      auVar15 = auVar15 ^ _DAT_00159050;
      do {
        auVar20._8_4_ = (int)uVar8;
        auVar20._0_8_ = uVar8;
        auVar20._12_4_ = (int)(uVar8 >> 0x20);
        auVar24 = (auVar20 | auVar5) ^ auVar6;
        iVar19 = auVar15._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar15._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(wchar_t *)(lVar7 + uVar8 * 4) = wVar2;
        }
        if ((auVar24._12_4_ != auVar15._12_4_ || auVar24._8_4_ <= auVar15._8_4_) &&
            auVar24._12_4_ <= auVar15._12_4_) {
          *(wchar_t *)(lVar7 + 4 + uVar8 * 4) = wVar2;
        }
        auVar24 = (auVar20 | auVar4) ^ auVar6;
        iVar26 = auVar24._4_4_;
        if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar15._0_4_)) {
          *(wchar_t *)(lVar7 + 8 + uVar8 * 4) = wVar2;
          *(wchar_t *)(lVar7 + 0xc + uVar8 * 4) = wVar2;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar10 >> 2) + 4 & 0x7ffffffffffffffc) != uVar8);
      uVar8 = f->size_;
      if (uVar8 != 0) {
        __src = f->s;
        goto LAB_00131243;
      }
    }
    else {
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(pvVar11,f->s,sVar1);
      }
      auVar6 = _DAT_00159050;
      auVar5 = _DAT_00159040;
      auVar4 = _DAT_00159030;
      uVar10 = (uVar13 * 4 + uVar8 * -4) - 4;
      auVar17._8_4_ = (int)uVar10;
      auVar17._0_8_ = uVar10;
      auVar17._12_4_ = (int)(uVar10 >> 0x20);
      auVar18._0_8_ = uVar10 >> 2;
      auVar18._8_8_ = auVar17._8_8_ >> 2;
      lVar7 = lVar9 * 4 + sVar1 + lVar7;
      uVar8 = 0;
      auVar18 = auVar18 ^ _DAT_00159050;
      do {
        auVar23._8_4_ = (int)uVar8;
        auVar23._0_8_ = uVar8;
        auVar23._12_4_ = (int)(uVar8 >> 0x20);
        auVar24 = (auVar23 | auVar5) ^ auVar6;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar18._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(wchar_t *)(lVar7 + uVar8 * 4) = wVar2;
        }
        if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
            auVar24._12_4_ <= auVar18._12_4_) {
          *(wchar_t *)(lVar7 + 4 + uVar8 * 4) = wVar2;
        }
        auVar24 = (auVar23 | auVar4) ^ auVar6;
        iVar26 = auVar24._4_4_;
        if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar18._0_4_)) {
          *(wchar_t *)(lVar7 + 8 + uVar8 * 4) = wVar2;
          *(wchar_t *)(lVar7 + 0xc + uVar8 * 4) = wVar2;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar10 >> 2) + 4 & 0x7ffffffffffffffc) != uVar8);
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }